

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

void __thiscall
Refal2::CGlobalFunctionData::SetEmbeddedFunction
          (CGlobalFunctionData *this,TEmbeddedFunctionPtr _embeddedFunction)

{
  bool bVar1;
  TEmbeddedFunctionPtr _embeddedFunction_local;
  CGlobalFunctionData *this_local;
  
  bVar1 = IsDefined(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!IsDefined()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                  ,0x7b,
                  "void Refal2::CGlobalFunctionData::SetEmbeddedFunction(const TEmbeddedFunctionPtr)"
                 );
  }
  if (_embeddedFunction != (TEmbeddedFunctionPtr)0x0) {
    this->embeddedFunction = _embeddedFunction;
    return;
  }
  __assert_fail("_embeddedFunction != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                ,0x7c,
                "void Refal2::CGlobalFunctionData::SetEmbeddedFunction(const TEmbeddedFunctionPtr)")
  ;
}

Assistant:

void CGlobalFunctionData::SetEmbeddedFunction(
	const TEmbeddedFunctionPtr _embeddedFunction )
{
	assert( !IsDefined() );
	assert( _embeddedFunction != nullptr );
	embeddedFunction = _embeddedFunction;
}